

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationWidget.cpp
# Opt level: O2

void __thiscall
UtilizationWidget::UtilizationWidget(UtilizationWidget *this,UtilizationContainer *container)

{
  int iVar1;
  QSizePolicy type;
  Connection local_40 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  
  QWidget::QWidget(&this->super_QWidget,0,0);
  *(undefined ***)this = &PTR_metaObject_00128340;
  *(undefined ***)&this->field_0x10 = &PTR__UtilizationWidget_001284f8;
  QVarLengthArray<UtilizationData,_256LL>::QVarLengthArray(&this->utilizationData);
  QVarLengthArray<std::vector<Point<float>,_std::allocator<Point<float>_>_>,_256LL>::QVarLengthArray
            (&this->graphPoints);
  QPainter::QPainter(&this->painter);
  this->lastTime = 0;
  iVar1 = InfoProvider::getGPUCount();
  QVarLengthArray<std::vector<Point<float>,_std::allocator<Point<float>_>_>,_256LL>::resize
            (&this->graphPoints,(long)iVar1);
  iVar1 = InfoProvider::getGPUCount();
  QVarLengthArray<UtilizationData,_256LL>::resize(&this->utilizationData,(long)iVar1);
  type.field_0 = SUB84(this,0);
  QWidget::setSizePolicy(type);
  QWidget::setMinimumHeight((int)type.field_0);
  local_38 = 0x1a1;
  uStack_30 = 0;
  QObject::connect<void(UtilizationContainer::*)(),void(UtilizationWidget::*)()>
            ((Object *)local_40,(offset_in_UtilizationContainer_to_subr)container,
             (Object *)UtilizationContainer::onDataUpdated,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection(local_40);
  return;
}

Assistant:

UtilizationWidget::UtilizationWidget(UtilizationContainer *container) {
    graphPoints.resize(InfoProvider::getGPUCount());
    utilizationData.resize(InfoProvider::getGPUCount());

    setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);
    setMinimumHeight(96);

    connect(container, &UtilizationContainer::onDataUpdated, this, &UtilizationWidget::onDataUpdated);
}